

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O3

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  long lVar2;
  FailedAssertion *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pixel dest [7];
  char local_b8 [24];
  undefined1 local_a0 [2];
  char local_9e;
  undefined1 uStack_9d;
  string local_90;
  string local_70;
  LocationInfo local_50;
  
  cVar1 = color::make('\0','\0','\0',0xff);
  iVar3 = ((uint)cVar1 >> 0x18) * 0x40 + (((uint)cVar1 >> 0x18) * 0x1f9) / 1000;
  iVar7 = iVar3 * 0x12;
  iVar6 = ((uint)cVar1 & 0xff) + 0x3fffff01;
  local_b8[0] = -1;
  local_b8[1] = -1;
  local_b8[2] = -1;
  local_b8[3] = -1;
  iVar4 = ((uint)cVar1 >> 8 & 0xff) + 0x3fffff01;
  local_b8[5] = (char)((uint)(iVar4 * iVar7) >> 0x16) + -1;
  local_b8[4] = (char)((uint)(iVar6 * iVar7) >> 0x16) + -1;
  iVar5 = ((uint)cVar1 >> 0x10 & 0xff) + 0x3fffff01;
  local_b8[6] = (char)((uint)(iVar7 * iVar5) >> 0x16) + -1;
  local_b8[7] = 0xff;
  iVar7 = iVar3 * 0x21;
  local_b8[9] = (char)((uint)(iVar4 * iVar7) >> 0x16) + -1;
  local_b8[8] = (char)((uint)(iVar6 * iVar7) >> 0x16) + -1;
  local_b8[10] = (char)((uint)(iVar7 * iVar5) >> 0x16) + -1;
  local_b8[0xb] = 0xff;
  iVar7 = iVar3 * 0x71;
  local_b8[0xd] = (char)((uint)(iVar4 * iVar7) >> 0x16) + -1;
  local_b8[0xc] = (char)((uint)(iVar6 * iVar7) >> 0x16) + -1;
  local_b8[0xe] = (char)((uint)(iVar7 * iVar5) >> 0x16) + -1;
  local_b8[0xf] = 0xff;
  iVar7 = iVar3 * 0x81;
  local_b8[0x11] = (char)((uint)(iVar4 * iVar7) >> 0x16) + -1;
  local_b8[0x10] = (char)((uint)(iVar6 * iVar7) >> 0x16) + -1;
  local_b8[0x12] = (char)((uint)(iVar7 * iVar5) >> 0x16) + -1;
  local_b8[0x13] = 0xff;
  iVar7 = iVar3 * 0xf0;
  local_b8[0x15] = (char)((uint)(iVar4 * iVar7) >> 0x16) + -1;
  local_b8[0x14] = (char)((uint)(iVar6 * iVar7) >> 0x16) + -1;
  local_b8[0x16] = (char)((uint)(iVar7 * iVar5) >> 0x16) + -1;
  local_b8[0x17] = 0xff;
  if (iVar3 == 0x4040) {
    _local_a0 = cVar1._0_3_;
  }
  else {
    iVar3 = iVar3 * 0xff;
    _local_a0 = CONCAT12((char)((uint)(iVar5 * iVar3) >> 0x16) + -1,
                         CONCAT11((char)((uint)(iVar4 * iVar3) >> 0x16) + -1,
                                  (char)((uint)(iVar6 * iVar3) >> 0x16) + -1));
  }
  _local_a0 = CONCAT13(0xff,_local_a0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_50,&local_90,99);
  lVar2 = 0;
  while( true ) {
    if ((((&DAT_0019f4a0)[lVar2] != local_b8[lVar2]) ||
        ((&DAT_0019f4a1)[lVar2] != local_b8[lVar2 + 1])) ||
       ((&DAT_0019f4a2)[lVar2] != local_b8[lVar2 + 2])) break;
    lVar2 = lVar2 + 4;
    if (lVar2 == 0x1c) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
        operator_delete(local_50.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      return;
    }
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel white = { { 0xFF, 0xFF, 0xFF, 0xFF } };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> blackness(color::make(0x00, 0x00, 0x00));
				pixel dest[n];

				fill_n(dest, n, white);

				// ACT
				blackness(dest + 0, 0, 0, 1, covers + 0);
				blackness(dest + 1, 0, 0, 1, covers + 1);
				blackness(dest + 2, 0, 0, 1, covers + 2);
				blackness(dest + 3, 0, 0, 1, covers + 3);
				blackness(dest + 4, 0, 0, 1, covers + 4);
				blackness(dest + 5, 0, 0, 1, covers + 5);
				blackness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
					{ { 0xED, 0xED, 0xED, 0xED } },
					{ { 0xDE, 0xDE, 0xDE, 0xDE } },
					{ { 0x8E, 0x8E, 0x8E, 0x8E } },
					{ { 0x7E, 0x7E, 0x7E, 0x7E } },
					{ { 0x0F, 0x0F, 0x0F, 0x0F } },
					{ { 0x00, 0x00, 0x00, 0x00 } },
				};

				assert_equal(reference, dest);
			}